

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O0

void __thiscall Downloader::Freeze(Downloader *this)

{
  size_t in_RCX;
  void *__buf;
  CCDir local_230;
  undefined1 local_150 [8];
  PackageList packagelist;
  string local_110;
  undefined1 local_f0 [8];
  CCDir ccdir;
  Downloader *this_local;
  
  ccdir.compiler_name.field_2._8_8_ = this;
  get_compiler_abi_cxx11_(&local_110,this,false);
  MakeCCDir((CCDir *)local_f0,this,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  PackageList::PackageList((PackageList *)local_150);
  CCDir::CCDir(&local_230,(CCDir *)local_f0);
  PackageList::read((PackageList *)local_150,(int)&local_230,__buf,in_RCX);
  CCDir::~CCDir(&local_230);
  PackageList::freeze((PackageList *)local_150);
  PackageList::~PackageList((PackageList *)local_150);
  CCDir::~CCDir((CCDir *)local_f0);
  return;
}

Assistant:

void Freeze(){
        CCDir ccdir=MakeCCDir(get_compiler(false));
        PackageList packagelist;
        packagelist.read(ccdir);
        packagelist.freeze();
    }